

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int str_to_label(char *dest,char *host,uint maxlen)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  
  sVar2 = strlen(host);
  uVar3 = 0;
  uVar4 = 1;
  iVar1 = 2;
  cVar5 = '\0';
  while( true ) {
    if (((long)(int)sVar2 <= (long)(uVar4 - 1)) || (maxlen <= uVar4)) break;
    if (host[uVar4 - 1] == '.') {
      dest[uVar3] = cVar5;
      cVar5 = '\0';
      uVar3 = (uint)uVar4;
    }
    else {
      dest[uVar4] = host[uVar4 - 1];
      cVar5 = cVar5 + '\x01';
    }
    uVar4 = uVar4 + 1;
    iVar1 = iVar1 + 1;
  }
  if ((long)(uVar4 - 1) < (long)(int)sVar2) {
    iVar1 = -1;
  }
  else {
    dest[uVar3] = cVar5;
    dest[uVar4] = '\0';
  }
  return iVar1;
}

Assistant:

int str_to_label(char *dest, const char *host, unsigned maxlen) {
  /*
  用于把域名转化成DNS格式
  例如   host = www.bupt.edu.cn
  转化为 host = \x1www\x4bupt\x3edu\x2cn\x0
  */
  int n = strlen(host);
  unsigned last_pos = 0, cumulate = 0;
  int i, j = 1; //空出第一格
  for (i = 0; i < n && j < maxlen; i++, j++) {
    if (host[i] == '.') {
      dest[last_pos] = cumulate;
      cumulate = 0;
      last_pos = j;
    } else {
      dest[j] = host[i];
      cumulate++;
    }
  }
  if (i < n)
    return -1;
  dest[last_pos] = cumulate;
  dest[j] = 0;
  return j + 1;
}